

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nextval.cpp
# Opt level: O0

SequenceCatalogEntry *
duckdb::BindSequenceFromContext(ClientContext *context,string *catalog,string *schema,string *name)

{
  SequenceCatalogEntry *pSVar1;
  ClientContext *in_RCX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *unaff_retaddr;
  string *in_stack_00000008;
  ClientContext *in_stack_00000010;
  optional_idx in_stack_ffffffffffffffd0;
  QueryErrorContext local_28;
  ClientContext *local_20;
  string *local_18;
  string *local_10;
  string *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Binder::BindSchemaOrCatalog(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  optional_idx::optional_idx((optional_idx *)&stack0xffffffffffffffd0);
  QueryErrorContext::QueryErrorContext(&local_28,in_stack_ffffffffffffffd0);
  pSVar1 = Catalog::GetEntry<duckdb::SequenceCatalogEntry>
                     (local_20,local_18,local_10,local_8,
                      (QueryErrorContext)in_stack_ffffffffffffffd0.index);
  return pSVar1;
}

Assistant:

SequenceCatalogEntry &BindSequenceFromContext(ClientContext &context, string &catalog, string &schema,
                                              const string &name) {
	Binder::BindSchemaOrCatalog(context, catalog, schema);
	return Catalog::GetEntry<SequenceCatalogEntry>(context, catalog, schema, name);
}